

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::uscalfe::test::
LinFEInterfaceEnergyTest<lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__1>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,test *this,int reflevels,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:279:7)>
          *v,MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:282:7)>
             *eta)

{
  element_type *this_00;
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  void *this_01;
  undefined4 in_register_00000014;
  EntityCenterPositionSelector<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:252:19)>
  *in_stack_fffffffffffffe98;
  uint local_108;
  int l;
  size_type L;
  shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>_> local_f0;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_e0;
  shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_> local_d0;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_c0;
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_> local_b0;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:282:7)>
  local_a0;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:282:7)>
  local_90;
  undefined1 local_80 [32];
  EntityCenterPositionSelector<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:252:19)>
  edge_sel;
  anon_class_1_0_00000001_for_pos_pred_ pos_pred;
  shared_ptr<lf::mesh::Mesh> local_48;
  undefined1 local_38 [8];
  shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:282:7)>
  *eta_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:279:7)>
  *v_local;
  int reflevels_local;
  vector<double,_std::allocator<double>_> *energies;
  
  multi_mesh_p.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v;
  lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)&local_48,0,0.3333333333333333);
  refinement::GenerateMeshHierarchyByUniformRefinemnt
            ((refinement *)local_38,&local_48,(size_type)this,rp_regular);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr(&local_48);
  edge_sel._11_1_ = 0;
  refinement::
  EntityCenterPositionSelector<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:252:19)>
  ::EntityCenterPositionSelector
            ((EntityCenterPositionSelector<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:252:19)>
              *)(local_80 + 0x18));
  local_80[0x16] = 0;
  this_00 = std::
            __shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:279:7)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:279:7)>
              *)local_80,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:279:7)>
              *)CONCAT44(in_register_00000014,reflevels));
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:282:7)>
  ::MeshFunctionGlobal
            (&local_90,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:282:7)>
              *)v);
  std::make_shared<lf::uscalfe::FeLagrangeO1Tria<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_a0,&local_b0);
  std::make_shared<lf::uscalfe::FeLagrangeO1Quad<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_c0,&local_d0);
  std::make_shared<lf::uscalfe::FeLagrangeO1Segment<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_e0,&local_f0);
  refinement::
  EntityCenterPositionSelector<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:252:19)>
  ::EntityCenterPositionSelector
            ((EntityCenterPositionSelector<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:252:19)>
              *)&l,(EntityCenterPositionSelector<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:252:19)>
                    *)(local_80 + 0x18));
  BoundaryEnergiesOfInterpolants<double,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__1>,lf::refinement::EntityCenterPositionSelector<lf::uscalfe::test::LinFEInterfaceEnergyTest<lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__1>>(int,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_full_bd_a_1_Test::TestBody()::__1>)::_lambda(Eigen::Matrix<double,2,1,0,2,1>)_1_>>
            (__return_storage_ptr__,(test *)this_00,(MeshHierarchy *)local_80,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:279:7)>
              *)&local_90,&local_a0,&local_c0,&local_e0,
             (shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)&l,
             in_stack_fffffffffffffe98);
  refinement::
  EntityCenterPositionSelector<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:252:19)>
  ::~EntityCenterPositionSelector
            ((EntityCenterPositionSelector<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:252:19)>
              *)&l);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_e0);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>_>::~shared_ptr(&local_f0);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_c0);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_>::~shared_ptr(&local_d0);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)&local_a0);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_>::~shared_ptr(&local_b0);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:282:7)>
  ::~MeshFunctionGlobal(&local_90);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:279:7)>
  ::~MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:279:7)>
              *)local_80);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
  for (local_108 = 0; local_108 < (uint)sVar1; local_108 = local_108 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Level");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_108);
    poVar2 = std::operator<<(poVar2,": energy = ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)(int)local_108);
    this_01 = (void *)std::ostream::operator<<(poVar2,*pvVar3);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  local_80[0x16] = 1;
  std::shared_ptr<lf::refinement::MeshHierarchy>::~shared_ptr
            ((shared_ptr<lf::refinement::MeshHierarchy> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> LinFEInterfaceEnergyTest(int reflevels, FFUNC v,
                                             IMP_COEFF eta) {
  // Generate hierarchy of meshes of the unit square
  std::shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p =
      lf::refinement::GenerateMeshHierarchyByUniformRefinemnt(
          lf::mesh::test_utils::GenerateHybrid2DTestMesh(0, 1.0 / 3),
          reflevels);
  // Select edges on top and right side of unit square
  auto pos_pred = [](Eigen::Vector2d x) -> bool {
    return ((x[0] + x[1]) > 1.0);
  };
  lf::refinement::EntityCenterPositionSelector edge_sel{pos_pred};

  // Compute energies of the pw. linear interpolants of v on the different
  // refinement levels
  std::vector<double> energies{BoundaryEnergiesOfInterpolants<double>(
      *multi_mesh_p, v, eta, std::make_shared<FeLagrangeO1Tria<double>>(),
      std::make_shared<FeLagrangeO1Quad<double>>(),
      std::make_shared<FeLagrangeO1Segment<double>>(), edge_sel)};
  // Output of energies
  size_type L = energies.size();
  for (int l = 0; l < L; ++l) {
    std::cout << "Level" << l << ": energy = " << energies[l] << std::endl;
  }
  return energies;
}